

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

lostFraction llvm::lostFractionThroughTruncation(integerPart *parts,uint partCount,uint bits)

{
  uint uVar1;
  lostFraction lVar2;
  int iVar3;
  
  uVar1 = APInt::tcLSB(parts,partCount);
  lVar2 = lfExactlyZero;
  if ((uVar1 < bits) && (lVar2 = lfExactlyHalf, uVar1 + 1 != bits)) {
    if ((bits <= partCount << 6) && (iVar3 = APInt::tcExtractBit(parts,bits - 1), iVar3 != 0)) {
      return lfMoreThanHalf;
    }
    lVar2 = lfLessThanHalf;
  }
  return lVar2;
}

Assistant:

static lostFraction
lostFractionThroughTruncation(const APFloatBase::integerPart *parts,
                              unsigned int partCount,
                              unsigned int bits)
{
  unsigned int lsb;

  lsb = APInt::tcLSB(parts, partCount);

  /* Note this is guaranteed true if bits == 0, or LSB == -1U.  */
  if (bits <= lsb)
    return lfExactlyZero;
  if (bits == lsb + 1)
    return lfExactlyHalf;
  if (bits <= partCount * APFloatBase::integerPartWidth &&
      APInt::tcExtractBit(parts, bits - 1))
    return lfMoreThanHalf;

  return lfLessThanHalf;
}